

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O1

int secp256k1_musig_nonce_agg
              (secp256k1_context *ctx,secp256k1_musig_aggnonce *aggnonce,
              secp256k1_musig_pubnonce **pubnonces,size_t n_pubnonces)

{
  int iVar1;
  secp256k1_gej *r;
  long lVar2;
  secp256k1_ge *ges;
  size_t sVar3;
  secp256k1_gej aggnonce_ptsj [2];
  secp256k1_ge aggnonce_pts [2];
  secp256k1_gej local_1e8;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined4 local_f0;
  secp256k1_ge local_e8 [2];
  
  if (aggnonce == (secp256k1_musig_aggnonce *)0x0) {
    secp256k1_musig_nonce_agg_cold_3();
  }
  else if (pubnonces == (secp256k1_musig_pubnonce **)0x0) {
    secp256k1_musig_nonce_agg_cold_2();
  }
  else if (n_pubnonces == 0) {
    secp256k1_musig_nonce_agg_cold_1();
  }
  else {
    local_1e8.infinity = 1;
    local_1e8.x.n[0] = 0;
    local_1e8.x.n[1] = 0;
    local_1e8.x.n[2] = 0;
    local_1e8.x.n[3] = 0;
    local_1e8.x.n[4] = 0;
    local_1e8.y.n[0] = 0;
    local_1e8.y.n[1] = 0;
    local_1e8.y.n[2] = 0;
    local_1e8.y.n[3] = 0;
    local_1e8.y.n[4] = 0;
    local_1e8.z.n[0] = 0;
    local_1e8.z.n[1] = 0;
    local_1e8.z.n[2] = 0;
    local_1e8.z.n[3] = 0;
    sVar3 = 0;
    local_1e8.z.n[4] = 0;
    local_f0 = 1;
    local_168 = 0;
    uStack_160 = 0;
    local_158 = 0;
    uStack_150 = 0;
    local_148 = 0;
    uStack_140 = 0;
    local_138 = 0;
    uStack_130 = 0;
    local_128 = 0;
    uStack_120 = 0;
    local_118 = 0;
    uStack_110 = 0;
    local_108 = 0;
    uStack_100 = 0;
    local_f8 = 0;
    while( true ) {
      ges = local_e8;
      iVar1 = secp256k1_musig_pubnonce_load(ctx,ges,pubnonces[sVar3]);
      if (iVar1 == 0) break;
      lVar2 = 0;
      do {
        r = (secp256k1_gej *)((long)local_1e8.x.n + lVar2);
        secp256k1_gej_add_ge_var(r,r,ges,(secp256k1_fe *)0x0);
        lVar2 = lVar2 + 0x80;
        ges = ges + 1;
      } while (lVar2 == 0x80);
      if (iVar1 == 0) {
        return 0;
      }
      sVar3 = sVar3 + 1;
      if (sVar3 == n_pubnonces) {
        secp256k1_ge_set_all_gej_var(local_e8,&local_1e8,2);
        secp256k1_musig_aggnonce_save(aggnonce,local_e8);
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int secp256k1_musig_nonce_agg(const secp256k1_context* ctx, secp256k1_musig_aggnonce  *aggnonce, const secp256k1_musig_pubnonce * const* pubnonces, size_t n_pubnonces) {
    secp256k1_gej aggnonce_ptsj[2];
    secp256k1_ge aggnonce_pts[2];
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(aggnonce != NULL);
    ARG_CHECK(pubnonces != NULL);
    ARG_CHECK(n_pubnonces > 0);

    if (!secp256k1_musig_sum_pubnonces(ctx, aggnonce_ptsj, pubnonces, n_pubnonces)) {
        return 0;
    }
    secp256k1_ge_set_all_gej_var(aggnonce_pts, aggnonce_ptsj, 2);
    secp256k1_musig_aggnonce_save(aggnonce, aggnonce_pts);
    return 1;
}